

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QAbstractButton ** __thiscall
QHash<QAbstractButton_*,_int>::keyImpl(QHash<QAbstractButton_*,_int> *this,int *value)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  const_iterator *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  const_iterator *in_stack_ffffffffffffffb0;
  QAbstractButton **local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->i).d != (Data *)0x0) {
    begin((QHash<QAbstractButton_*,_int> *)in_RDI);
    while( true ) {
      end((QHash<QAbstractButton_*,_int> *)in_RDI);
      bVar2 = const_iterator::operator!=(in_RDI,in_stack_ffffffffffffffb0);
      if (!bVar2) break;
      piVar3 = const_iterator::value((const_iterator *)0x515553);
      if (*piVar3 == *(int *)&(in_RSI->i).d) {
        local_30 = const_iterator::key((const_iterator *)0x515568);
        goto LAB_00515586;
      }
      const_iterator::operator++(in_RSI);
    }
  }
  local_30 = (QAbstractButton **)0x0;
LAB_00515586:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }